

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<kj::AppendableFile> __thiscall
kj::Directory::appendFile(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  AppendableFile *pAVar1;
  ulong in_R8;
  Own<kj::AppendableFile> OVar2;
  Fault f_1;
  AppendableFile *local_60;
  OwnOwn<kj::AppendableFile> f;
  PathPtr path_local;
  Own<const_kj::File> local_38;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x80))(&f_1);
  f.value.disposer = (Disposer *)f_1.exception;
  f.value.ptr = local_60;
  Own<kj::AppendableFile>::dispose((Own<kj::AppendableFile> *)&f_1);
  if (local_60 == (AppendableFile *)0x0) {
    if ((in_R8 & 1) == 0) {
      if ((in_R8 & 2) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x256,FAILED,(char *)0x0,
                   "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                   (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                   &path_local);
        kj::_::Debug::Fault::~Fault(&f_1);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x254,FAILED,(char *)0x0,"\"file does not exist\", path",
                   (char (*) [20])"file does not exist",&path_local);
        kj::_::Debug::Fault::~Fault(&f_1);
      }
    }
    else if ((in_R8 & 2) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x252,FAILED,(char *)0x0,"\"file already exists\", path",
                 (char (*) [20])"file already exists",&path_local);
      kj::_::Debug::Fault::~Fault(&f_1);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x259,FAILED,(char *)0x0,
                 "\"tryAppendFile() returned null despite no preconditions\", path",
                 (char (*) [55])"tryAppendFile() returned null despite no preconditions",&path_local
                );
      kj::_::Debug::Fault::~Fault(&f_1);
    }
  }
  else {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f_1.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)local_60;
    f.value.ptr = (AppendableFile *)0x0;
  }
  Own<kj::AppendableFile>::dispose(&f.value);
  pAVar1 = extraout_RDX;
  if (local_60 == (AppendableFile *)0x0) {
    clock = nullClock();
    newInMemoryFile((kj *)&f,clock);
    local_38.disposer = f.value.disposer;
    local_38.ptr = (File *)f.value.ptr;
    f.value.ptr = (AppendableFile *)0x0;
    newFileAppender((kj *)this,&local_38);
    Own<const_kj::File>::dispose(&local_38);
    Own<kj::File>::dispose((Own<kj::File> *)&f);
    pAVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pAVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<AppendableFile> Directory::appendFile(PathPtr path, WriteMode mode) const {
  KJ_IF_MAYBE(f, tryAppendFile(path, mode)) {
    return kj::mv(*f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryAppendFile() returned null despite no preconditions", path) { break; }